

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_item.cpp
# Opt level: O0

int menu_item_accel_offset_proc(Am_Object *self)

{
  Am_Value *in_value;
  Am_Widget_Look local_1c;
  Am_Object *pAStack_18;
  Am_Widget_Look look;
  Am_Object *self_local;
  
  pAStack_18 = self;
  in_value = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&local_1c,in_value);
  if (local_1c.value == Am_MOTIF_LOOK_val) {
    self_local._4_4_ = 0x10;
  }
  else if (local_1c.value == Am_WINDOWS_LOOK_val) {
    self_local._4_4_ = 9;
  }
  else {
    if (local_1c.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    self_local._4_4_ = 0xb;
  }
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, menu_item_accel_offset)
{
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);
  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    return 16;

  case Am_WINDOWS_LOOK_val:
    return 9;

  case Am_MACINTOSH_LOOK_val:
    return 11;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
  return 6; // we should never get here
}